

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

Error * stick::fs::copyFile(Error *__return_storage_ptr__,String *_from,String *_to)

{
  SystemErrorCode SVar1;
  ErrorCategory *pEVar2;
  bool bVar3;
  int __fd;
  SystemErrorCode *pSVar4;
  size_t __n;
  ssize_t sVar5;
  int *piVar6;
  char *outPtr;
  undefined1 *__buf;
  undefined1 local_10d8 [8];
  char buffer [4096];
  Error local_b8;
  String local_58;
  int local_34;
  
  stick::Error::Error(__return_storage_ptr__);
  local_34 = open(_from->m_cStr,0);
  if (local_34 == -1) {
    pSVar4 = (SystemErrorCode *)__errno_location();
    SVar1 = *pSVar4;
    if (defaultAllocator()::m_def == '\0') {
      copyFile();
    }
    local_b8.m_category = (ErrorCategory *)0x0;
    local_b8.m_code = 0;
    local_b8._12_4_ = 0;
    local_b8.m_message.m_cStr = (char *)0x0;
    local_b8.m_message.m_length = (Size)defaultAllocator::m_def;
    stick::Error::Error<stick::ec::SystemErrorCode>
              ((Error *)local_10d8,SVar1,(String *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
               ,0x1c9,(type *)0x0);
    __return_storage_ptr__->m_code = buffer._0_4_;
    __return_storage_ptr__->m_category = (ErrorCategory *)local_10d8;
    pEVar2 = (ErrorCategory *)(__return_storage_ptr__->m_message).m_cStr;
    if (pEVar2 != (ErrorCategory *)0x0) {
      local_58.m_length = (__return_storage_ptr__->m_message).m_capacity + 1;
      local_58.m_cStr = (char *)pEVar2;
      (*((__return_storage_ptr__->m_message).m_allocator)->_vptr_Allocator[3])();
      (__return_storage_ptr__->m_message).m_cStr = (char *)0x0;
      (__return_storage_ptr__->m_message).m_length = 0;
      (__return_storage_ptr__->m_message).m_capacity = 0;
    }
    (__return_storage_ptr__->m_message).m_cStr = (char *)buffer._8_8_;
    (__return_storage_ptr__->m_message).m_allocator = (Allocator *)buffer._32_8_;
    (__return_storage_ptr__->m_message).m_length = buffer._16_8_;
    (__return_storage_ptr__->m_message).m_capacity = buffer._24_8_;
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    pEVar2 = (ErrorCategory *)(__return_storage_ptr__->m_file).m_cStr;
    if (pEVar2 != (ErrorCategory *)0x0) {
      local_58.m_length = (__return_storage_ptr__->m_file).m_capacity + 1;
      local_58.m_cStr = (char *)pEVar2;
      (*((__return_storage_ptr__->m_file).m_allocator)->_vptr_Allocator[3])();
      (__return_storage_ptr__->m_file).m_cStr = (char *)0x0;
      (__return_storage_ptr__->m_file).m_length = 0;
      (__return_storage_ptr__->m_file).m_capacity = 0;
    }
    (__return_storage_ptr__->m_file).m_cStr = (char *)buffer._40_8_;
    (__return_storage_ptr__->m_file).m_allocator = (Allocator *)buffer._64_8_;
    (__return_storage_ptr__->m_file).m_length = buffer._48_8_;
    (__return_storage_ptr__->m_file).m_capacity = buffer._56_8_;
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    __return_storage_ptr__->m_line = buffer._72_4_;
    if (buffer._8_8_ != 0) {
      local_58.m_length = buffer._24_8_ + 1;
      local_58.m_cStr = (char *)buffer._8_8_;
      (**(code **)(*(long *)buffer._32_8_ + 0x18))();
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
    }
    if (local_b8.m_category != (ErrorCategory *)0x0) {
      local_58.m_length = (Size)(local_b8.m_message.m_cStr + 1);
      local_58.m_cStr = (char *)local_b8.m_category;
      (*((Allocator *)local_b8.m_message.m_length)->_vptr_Allocator[3])();
      local_b8.m_category = (ErrorCategory *)0x0;
      local_b8.m_code = 0;
      local_b8._12_4_ = 0;
      local_b8.m_message.m_cStr = (char *)0x0;
    }
  }
  __fd = open(_to->m_cStr,0xc1,0x1b6);
  if (__fd == -1) {
    pSVar4 = (SystemErrorCode *)__errno_location();
    SVar1 = *pSVar4;
    if (defaultAllocator()::m_def == '\0') {
      copyFile();
    }
    local_b8.m_category = (ErrorCategory *)0x0;
    local_b8.m_code = 0;
    local_b8._12_4_ = 0;
    local_b8.m_message.m_cStr = (char *)0x0;
    local_b8.m_message.m_length = (Size)defaultAllocator::m_def;
    stick::Error::Error<stick::ec::SystemErrorCode>
              ((Error *)local_10d8,SVar1,(String *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
               ,0x1cf,(type *)0x0);
    __return_storage_ptr__->m_code = buffer._0_4_;
    __return_storage_ptr__->m_category = (ErrorCategory *)local_10d8;
    pEVar2 = (ErrorCategory *)(__return_storage_ptr__->m_message).m_cStr;
    if (pEVar2 != (ErrorCategory *)0x0) {
      local_58.m_length = (__return_storage_ptr__->m_message).m_capacity + 1;
      local_58.m_cStr = (char *)pEVar2;
      (*((__return_storage_ptr__->m_message).m_allocator)->_vptr_Allocator[3])();
      (__return_storage_ptr__->m_message).m_cStr = (char *)0x0;
      (__return_storage_ptr__->m_message).m_length = 0;
      (__return_storage_ptr__->m_message).m_capacity = 0;
    }
    (__return_storage_ptr__->m_message).m_cStr = (char *)buffer._8_8_;
    (__return_storage_ptr__->m_message).m_allocator = (Allocator *)buffer._32_8_;
    (__return_storage_ptr__->m_message).m_length = buffer._16_8_;
    (__return_storage_ptr__->m_message).m_capacity = buffer._24_8_;
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    pEVar2 = (ErrorCategory *)(__return_storage_ptr__->m_file).m_cStr;
    if (pEVar2 != (ErrorCategory *)0x0) {
      local_58.m_length = (__return_storage_ptr__->m_file).m_capacity + 1;
      local_58.m_cStr = (char *)pEVar2;
      (*((__return_storage_ptr__->m_file).m_allocator)->_vptr_Allocator[3])();
      (__return_storage_ptr__->m_file).m_cStr = (char *)0x0;
      (__return_storage_ptr__->m_file).m_length = 0;
      (__return_storage_ptr__->m_file).m_capacity = 0;
    }
    (__return_storage_ptr__->m_file).m_cStr = (char *)buffer._40_8_;
    (__return_storage_ptr__->m_file).m_allocator = (Allocator *)buffer._64_8_;
    (__return_storage_ptr__->m_file).m_length = buffer._48_8_;
    (__return_storage_ptr__->m_file).m_capacity = buffer._56_8_;
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    __return_storage_ptr__->m_line = buffer._72_4_;
    if (buffer._8_8_ != 0) {
      local_58.m_length = buffer._24_8_ + 1;
      local_58.m_cStr = (char *)buffer._8_8_;
      (**(code **)(*(long *)buffer._32_8_ + 0x18))();
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
    }
    if (local_b8.m_category != (ErrorCategory *)0x0) {
      local_58.m_length = (Size)(local_b8.m_message.m_cStr + 1);
      local_58.m_cStr = (char *)local_b8.m_category;
      (*((Allocator *)local_b8.m_message.m_length)->_vptr_Allocator[3])();
      local_b8.m_category = (ErrorCategory *)0x0;
      local_b8.m_code = 0;
      local_b8._12_4_ = 0;
      local_b8.m_message.m_cStr = (char *)0x0;
    }
    close(local_34);
  }
  __n = read(local_34,local_10d8,0x1000);
  if (__n != 0) {
    bVar3 = false;
    __buf = local_10d8;
LAB_00113ccb:
    do {
      sVar5 = write(__fd,__buf,__n);
      if (sVar5 < 0) {
        piVar6 = __errno_location();
        if (*piVar6 == 4) goto LAB_00113cf0;
        bVar3 = true;
      }
      else {
        __n = __n - sVar5;
        __buf = __buf + sVar5;
LAB_00113cf0:
        if (__n != 0) goto LAB_00113ccb;
      }
      __n = read(local_34,local_10d8,0x1000);
      if ((__n == 0) || (__buf = local_10d8, bVar3)) goto LAB_00113d18;
    } while( true );
  }
LAB_00113ee3:
  close(local_34);
  close(__fd);
  return __return_storage_ptr__;
LAB_00113d18:
  if (bVar3) {
    pSVar4 = (SystemErrorCode *)__errno_location();
    SVar1 = *pSVar4;
    if (defaultAllocator()::m_def == '\0') {
      copyFile();
    }
    local_58.m_cStr = (char *)0x0;
    local_58.m_length = 0;
    local_58.m_capacity = 0;
    local_58.m_allocator = &defaultAllocator::m_def->super_Allocator;
    stick::Error::Error<stick::ec::SystemErrorCode>
              (&local_b8,SVar1,&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
               ,0x1eb,(type *)0x0);
    __return_storage_ptr__->m_code = local_b8.m_code;
    __return_storage_ptr__->m_category = local_b8.m_category;
    if ((__return_storage_ptr__->m_message).m_cStr != (char *)0x0) {
      (*((__return_storage_ptr__->m_message).m_allocator)->_vptr_Allocator[3])();
      (__return_storage_ptr__->m_message).m_cStr = (char *)0x0;
      (__return_storage_ptr__->m_message).m_length = 0;
      (__return_storage_ptr__->m_message).m_capacity = 0;
    }
    (__return_storage_ptr__->m_message).m_cStr = local_b8.m_message.m_cStr;
    (__return_storage_ptr__->m_message).m_allocator = local_b8.m_message.m_allocator;
    (__return_storage_ptr__->m_message).m_length = local_b8.m_message.m_length;
    (__return_storage_ptr__->m_message).m_capacity = local_b8.m_message.m_capacity;
    local_b8.m_message.m_cStr = (char *)0x0;
    if ((__return_storage_ptr__->m_file).m_cStr != (char *)0x0) {
      (*((__return_storage_ptr__->m_file).m_allocator)->_vptr_Allocator[3])();
      (__return_storage_ptr__->m_file).m_cStr = (char *)0x0;
      (__return_storage_ptr__->m_file).m_length = 0;
      (__return_storage_ptr__->m_file).m_capacity = 0;
    }
    (__return_storage_ptr__->m_file).m_cStr = local_b8.m_file.m_cStr;
    (__return_storage_ptr__->m_file).m_allocator = local_b8.m_file.m_allocator;
    (__return_storage_ptr__->m_file).m_length = local_b8.m_file.m_length;
    (__return_storage_ptr__->m_file).m_capacity = local_b8.m_file.m_capacity;
    local_b8.m_file.m_cStr = (char *)0x0;
    __return_storage_ptr__->m_line = local_b8.m_line;
    if (local_b8.m_message.m_cStr != (char *)0x0) {
      (*(local_b8.m_message.m_allocator)->_vptr_Allocator[3])();
      local_b8.m_message.m_cStr = (char *)0x0;
      local_b8.m_message.m_length = 0;
      local_b8.m_message.m_capacity = 0;
    }
    if ((ErrorCategory *)local_58.m_cStr != (ErrorCategory *)0x0) {
      (*((Allocator *)&(local_58.m_allocator)->_vptr_Allocator)->_vptr_Allocator[3])();
      local_58.m_cStr = (char *)0x0;
      local_58.m_length = 0;
      local_58.m_capacity = 0;
    }
  }
  goto LAB_00113ee3;
}

Assistant:

Error copyFile(const String & _from, const String & _to)
{
    Error ret;
    int fdFrom, fdTo;
    char buffer[4096];
    Size numBytesRead;

    fdFrom = open(_from.cString(), O_RDONLY);
    if (fdFrom == -1)
    {
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);
    }

    fdTo = open(_to.cString(), O_WRONLY | O_CREAT | O_EXCL, 0666);
    if (fdTo == -1)
    {
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);
        close(fdFrom);
    }

    bool bBreak = false;
    while (numBytesRead = read(fdFrom, buffer, sizeof(buffer)), numBytesRead > 0 && !bBreak)
    {
        char * outPtr = buffer;
        Int64 numBytesWritten;
        do
        {
            numBytesWritten = write(fdTo, outPtr, numBytesRead);

            if (numBytesWritten >= 0)
            {
                numBytesRead -= numBytesWritten;
                outPtr += numBytesWritten;
            }
            else if (errno != EINTR)
            {
                bBreak = true;
                break;
            }
        } while (numBytesRead > 0);
    }

    // error, retrieve it
    if (bBreak)
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);

    close(fdFrom);
    close(fdTo);

    return ret;
}